

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O0

ares_status_t
ares_process_fds_nolock(ares_channel_t *channel,ares_fd_events_t *events,size_t nevents,uint flags)

{
  ares_status_t local_4c;
  ulong uStack_48;
  ares_status_t status;
  size_t i;
  ares_timeval_t now;
  uint flags_local;
  size_t nevents_local;
  ares_fd_events_t *events_local;
  ares_channel_t *channel_local;
  
  local_4c = ARES_SUCCESS;
  if ((channel == (ares_channel_t *)0x0) || ((events == (ares_fd_events_t *)0x0 && (nevents != 0))))
  {
    channel_local._4_4_ = ARES_EFORMERR;
  }
  else {
    now._12_4_ = flags;
    ares_tvnow((ares_timeval_t *)&i);
    for (uStack_48 = 0; uStack_48 < nevents; uStack_48 = uStack_48 + 1) {
      if (((events[uStack_48].fd != -1) && ((events[uStack_48].events & 2) != 0)) &&
         (local_4c = process_write(channel,events[uStack_48].fd), local_4c == ARES_ENOMEM))
      goto LAB_00117499;
    }
    for (uStack_48 = 0; uStack_48 < nevents; uStack_48 = uStack_48 + 1) {
      if (((events[uStack_48].fd != -1) && ((events[uStack_48].events & 1) != 0)) &&
         (local_4c = process_read(channel,events[uStack_48].fd,(ares_timeval_t *)&i),
         local_4c == ARES_ENOMEM)) goto LAB_00117499;
    }
    if ((now._12_4_ & 1) == 0) {
      ares_check_cleanup_conns(channel);
      local_4c = process_timeouts(channel,(ares_timeval_t *)&i);
    }
LAB_00117499:
    if (local_4c == ARES_ENOMEM) {
      channel_local._4_4_ = ARES_ENOMEM;
    }
    else {
      channel_local._4_4_ = ARES_SUCCESS;
    }
  }
  return channel_local._4_4_;
}

Assistant:

static ares_status_t ares_process_fds_nolock(ares_channel_t         *channel,
                                             const ares_fd_events_t *events,
                                             size_t nevents, unsigned int flags)
{
  ares_timeval_t now;
  size_t         i;
  ares_status_t  status = ARES_SUCCESS;

  if (channel == NULL || (events == NULL && nevents != 0)) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  ares_tvnow(&now);

  /* Process write events */
  for (i = 0; i < nevents; i++) {
    if (events[i].fd == ARES_SOCKET_BAD ||
        !(events[i].events & ARES_FD_EVENT_WRITE)) {
      continue;
    }
    status = process_write(channel, events[i].fd);
    /* We only care about ENOMEM, anything else is handled via connection
     * retries, etc */
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

  /* Process read events */
  for (i = 0; i < nevents; i++) {
    if (events[i].fd == ARES_SOCKET_BAD ||
        !(events[i].events & ARES_FD_EVENT_READ)) {
      continue;
    }
    status = process_read(channel, events[i].fd, &now);
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

  if (!(flags & ARES_PROCESS_FLAG_SKIP_NON_FD)) {
    ares_check_cleanup_conns(channel);
    status = process_timeouts(channel, &now);
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

done:
  if (status == ARES_ENOMEM) {
    return ARES_ENOMEM;
  }
  return ARES_SUCCESS;
}